

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.h
# Opt level: O3

int __thiscall Gradient::addPoint(Gradient *this,GradientPoint *point)

{
  GradientPoint *pGVar1;
  const_iterator __position;
  
  __position._M_current =
       (this->points).super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>._M_impl.
       super__Vector_impl_data._M_start;
  pGVar1 = (this->points).super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__position._M_current != pGVar1) {
    do {
      if (point->units < (__position._M_current)->units ||
          point->units == (__position._M_current)->units) break;
      __position._M_current = __position._M_current + 1;
    } while (__position._M_current != pGVar1);
  }
  std::vector<GradientPoint,_std::allocator<GradientPoint>_>::insert(&this->points,__position,point)
  ;
  return (int)((ulong)((long)(this->points).
                             super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->points).
                            super__Vector_base<GradientPoint,_std::allocator<GradientPoint>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x49249249;
}

Assistant:

int addPoint(const GradientPoint &point) {
    auto i = points.begin();
    while (i != points.end() && i->units < point.units) i++;
    points.insert(i, point);
    return size();
  }